

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTcEmbedTokenList::unget(CTcEmbedTokenList *this,int n,int m)

{
  int iVar1;
  CTcTokenEle *prv;
  
  prv = this->wrt;
  iVar1 = 0;
  while ((prv = prv->prv_, m != iVar1 && (prv != (CTcTokenEle *)0x0))) {
    iVar1 = iVar1 + 1;
  }
  for (iVar1 = this->cnt - iVar1; (prv != (CTcTokenEle *)0x0 && (n < iVar1)); iVar1 = iVar1 + -1) {
    CTcTokenizer::unget(G_tok,&prv->super_CTcToken);
    prv = prv->prv_;
  }
  return;
}

Assistant:

void unget(int n = 0, int m = 0)
    {
        /* skip the last 'm' tokens */
        CTcTokenEle *ele;
        int i;
        for (ele = wrt->getprv(), i = cnt ; m != 0 && ele != 0 ;
             ele = ele->getprv(), --m, --i) ;

        /* unget tokens until we're down to the first 'n' */
        for ( ; ele != 0 && i > n ; ele = ele->getprv(), --i)
            G_tok->unget(ele);
    }